

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeDependencies.hpp
# Opt level: O0

void __thiscall
helics::DependencyInfo::DependencyInfo<helics::TimeState,unsigned_char>
          (DependencyInfo *this,Time start,TimeState *args,uchar *args_1)

{
  undefined8 in_RCX;
  TimeData *in_RDX;
  Time in_RDI;
  
  TimeData::TimeData(in_RDX,in_RDI,(TimeState)((ulong)in_RCX >> 0x38),
                     (uint8_t)((ulong)in_RCX >> 0x30));
  memset((GlobalFederateId *)(in_RDI.internalTimeCode + 0x48),0,4);
  GlobalFederateId::GlobalFederateId((GlobalFederateId *)(in_RDI.internalTimeCode + 0x48));
  *(undefined1 *)(in_RDI.internalTimeCode + 0x4c) = 0;
  *(undefined1 *)(in_RDI.internalTimeCode + 0x4d) = 0;
  *(undefined1 *)(in_RDI.internalTimeCode + 0x4e) = 0;
  *(undefined1 *)(in_RDI.internalTimeCode + 0x4f) = 0;
  *(undefined1 *)(in_RDI.internalTimeCode + 0x50) = 0;
  *(undefined1 *)(in_RDI.internalTimeCode + 0x51) = 0;
  *(undefined1 *)(in_RDI.internalTimeCode + 0x52) = 0;
  *(undefined1 *)(in_RDI.internalTimeCode + 0x53) = 0;
  return;
}

Assistant:

explicit DependencyInfo(Time start, Args&&... args):
        TimeData(start, std::forward<Args>(args)...)
    {
    }